

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O2

void process_statement_list(CompilerState *compiler_state,AstNodeList *list)

{
  AstNodeList **ppAVar1;
  anon_union_72_25_595a31af_for_AstNode_2 *list_00;
  byte *pbVar2;
  LuaSymbolList **list_01;
  AstNodeList **list_02;
  uint uVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  AstNode *pAVar7;
  Scope *scope;
  AstNode *pAVar8;
  StringObject *pSVar9;
  LuaSymbol *pLVar10;
  LuaSymbol *sym;
  LuaSymbol *sym_00;
  LuaSymbolList *pLVar11;
  AstNode *pAVar12;
  AstNode *pAVar13;
  AstNode *pAVar14;
  AstNodeList *pAVar15;
  Scope *pSVar16;
  AstNode *pAVar17;
  long lVar18;
  AstNodeList *pAVar19;
  int *piVar20;
  byte bVar21;
  char s [8];
  char f [8];
  PtrListIterator local_60;
  PtrListIterator nodeiter__;
  
  bVar21 = 0;
  raviX_ptrlist_forward_iterator(&nodeiter__,(PtrList *)list);
LAB_0010aa60:
switchD_0010aa94_caseD_0:
  piVar5 = (int *)raviX_ptrlist_iter_next(&nodeiter__);
  if (piVar5 == (int *)0x0) {
    return;
  }
  switch(*piVar5) {
  case 0:
  case 2:
  case 3:
  case 0xe:
    goto switchD_0010aa94_caseD_0;
  case 1:
    pAVar19 = *(AstNodeList **)(piVar5 + 2);
    goto LAB_0010aab4;
  case 4:
    pAVar19 = *(AstNodeList **)(piVar5 + 4);
    break;
  case 5:
    goto switchD_0010aa94_caseD_5;
  case 6:
    pAVar17 = *(AstNode **)(piVar5 + 8);
    goto LAB_0010ab58;
  case 7:
    raviX_ptrlist_forward_iterator(&local_60,*(PtrList **)(piVar5 + 2));
    while (pvVar6 = raviX_ptrlist_iter_next(&local_60), pvVar6 != (void *)0x0) {
      process_expression(compiler_state,*(AstNode **)((long)pvVar6 + 8));
      process_statement_list(compiler_state,*(AstNodeList **)((long)pvVar6 + 0x18));
    }
    if (*(long *)(piVar5 + 4) != 0) goto LAB_0010ab2d;
    goto switchD_0010aa94_caseD_0;
  default:
    fprintf(_stderr,"AST = %d\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_lower.c"
                  ,0x197,"void process_statement(CompilerState *, AstNode *)");
  case 9:
    process_expression(compiler_state,*(AstNode **)(piVar5 + 2));
LAB_0010ab2d:
    pAVar19 = *(AstNodeList **)(piVar5 + 6);
    break;
  case 10:
    goto switchD_0010aa94_caseD_a;
  case 0xb:
    process_expression_list(compiler_state,*(AstNodeList **)(piVar5 + 6));
    pAVar19 = *(AstNodeList **)(piVar5 + 10);
    break;
  case 0xc:
    process_statement_list(compiler_state,*(AstNodeList **)(piVar5 + 6));
    pAVar17 = *(AstNode **)(piVar5 + 2);
LAB_0010ab58:
    process_expression(compiler_state,pAVar17);
    goto switchD_0010aa94_caseD_0;
  case 0xd:
    if (*(AstNodeList **)(piVar5 + 2) != (AstNodeList *)0x0) {
      process_expression_list(compiler_state,*(AstNodeList **)(piVar5 + 2));
    }
    goto switchD_0010aa94_caseD_5;
  }
  process_statement_list(compiler_state,pAVar19);
  goto switchD_0010aa94_caseD_0;
switchD_0010aa94_caseD_a:
  pSVar16 = *(Scope **)(piVar5 + 2);
  pAVar17 = pSVar16->function;
  pAVar19 = *(AstNodeList **)(piVar5 + 8);
  pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,piVar5[1]);
  ppAVar1 = &(pAVar7->field_2).local_stmt.expr_list;
  (pAVar7->field_2).goto_stmt.name = (StringObject *)0x0;
  scope = raviX_allocate_scope(compiler_state,pAVar17,pSVar16->parent);
  (pAVar7->field_2).do_stmt.scope = scope;
  builtin_strncpy(f,"(for_f)",8);
  builtin_strncpy(s,"(for_s)",8);
  local_60.__head = (PtrList *)0x7261765f726f6628;
  local_60.__list._0_2_ = 0x29;
  pAVar8 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,piVar5[1]);
  (pAVar8->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  list_00 = &pAVar8->field_2;
  (pAVar8->field_2).goto_stmt.name = *(StringObject **)(piVar5 + 6);
  pSVar9 = raviX_create_string(compiler_state,f,7);
  pLVar10 = raviX_new_local_symbol(compiler_state,scope,pSVar9,RAVI_TANY,(StringObject *)0x0);
  pSVar9 = raviX_create_string(compiler_state,s,7);
  sym = raviX_new_local_symbol(compiler_state,scope,pSVar9,RAVI_TANY,(StringObject *)0x0);
  pSVar9 = raviX_create_string(compiler_state,(char *)&local_60,9);
  sym_00 = raviX_new_local_symbol(compiler_state,scope,pSVar9,RAVI_TANY,(StringObject *)0x0);
  pbVar2 = (byte *)((long)&pLVar10->field_1 + 0x28);
  *pbVar2 = *pbVar2 | 4;
  pbVar2 = (byte *)((long)&sym->field_1 + 0x28);
  *pbVar2 = *pbVar2 | 4;
  pbVar2 = (byte *)((long)&sym_00->field_1 + 0x28);
  *pbVar2 = *pbVar2 | 4;
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&list_00->return_stmt,pLVar10);
  list_01 = &scope->symbol_list;
  raviX_add_symbol(compiler_state,list_01,pLVar10);
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&list_00->return_stmt,sym);
  raviX_add_symbol(compiler_state,list_01,sym);
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&list_00->return_stmt,sym_00);
  raviX_add_symbol(compiler_state,list_01,sym_00);
  add_ast_node(compiler_state,ppAVar1,pAVar8);
  pAVar8 = raviX_allocate_ast_node_at_line(compiler_state,STMT_WHILE,piVar5[1]);
  pSVar16->parent = scope;
  (pAVar8->field_2).test_then_block.test_then_scope = pSVar16;
  list_02 = &(pAVar8->field_2).test_then_block.test_then_statement_list;
  (pAVar8->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pLVar11 = (LuaSymbolList *)allocate_expr_ast_node(compiler_state,EXPR_LITERAL);
  *(undefined4 *)&pLVar11->prev_ = 7;
  pLVar11->next_ = (LuaSymbolList *)0x0;
  pLVar11->list_[0] = (LuaSymbol *)0x1;
  (pAVar8->field_2).local_stmt.var_list = pLVar11;
  add_ast_node(compiler_state,ppAVar1,pAVar8);
  pAVar8 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,piVar5[1]);
  (pAVar8->field_2).return_stmt.expr_list = *(AstNodeList **)(piVar5 + 4);
  (pAVar8->field_2).goto_stmt.name = (StringObject *)0x0;
  iVar4 = raviX_ptrlist_size(*(PtrList **)(piVar5 + 4));
  pAVar12 = allocate_expr_ast_node(compiler_state,EXPR_SUFFIXED);
  pAVar13 = make_symbol_expr(compiler_state,pLVar10);
  (pAVar12->field_2).function_stmt.function_expr = pAVar13;
  (pAVar12->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar12->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar12->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  pAVar13 = allocate_expr_ast_node(compiler_state,EXPR_FUNCTION_CALL);
  (pAVar13->field_2).function_stmt.function_expr = (AstNode *)0x0;
  (pAVar13->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  (pAVar13->field_2).function_call_expr.num_results = iVar4;
  (pAVar13->field_2).common_expr.type.type_code = RAVI_TANY;
  ppAVar1 = &(pAVar13->field_2).for_stmt.for_statement_list;
  (pAVar13->field_2).goto_stmt.name = (StringObject *)0x0;
  pAVar14 = make_symbol_expr(compiler_state,sym);
  add_ast_node(compiler_state,ppAVar1,pAVar14);
  pAVar14 = make_symbol_expr(compiler_state,sym_00);
  add_ast_node(compiler_state,ppAVar1,pAVar14);
  add_ast_node(compiler_state,&(pAVar12->field_2).for_stmt.for_statement_list,pAVar13);
  add_ast_node(compiler_state,&(pAVar8->field_2).local_stmt.expr_list,pAVar12);
  add_ast_node(compiler_state,list_02,pAVar8);
  pLVar10 = (LuaSymbol *)raviX_ptrlist_first(*(PtrList **)(piVar5 + 4));
  pAVar8 = raviX_allocate_ast_node_at_line(compiler_state,STMT_IF,piVar5[1]);
  (pAVar8->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar8->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar8->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pAVar12 = raviX_allocate_ast_node_at_line(compiler_state,STMT_TEST_THEN,piVar5[1]);
  pAVar15 = (AstNodeList *)allocate_expr_ast_node(compiler_state,EXPR_BINARY);
  pAVar13 = make_symbol_expr(compiler_state,pLVar10);
  pAVar15->list_[0] = pAVar13;
  pAVar13 = allocate_expr_ast_node(compiler_state,EXPR_LITERAL);
  (pAVar13->field_2).common_expr.type.type_code = RAVI_TNIL;
  (pAVar13->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar13->field_2).function_stmt.function_expr = (AstNode *)0x0;
  pAVar15->list_[1] = pAVar13;
  *(undefined4 *)((long)&pAVar15->allocator_ + 4) = 0xd;
  (pAVar12->field_2).expression_stmt.var_expr_list = pAVar15;
  (pAVar12->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar12->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pSVar16 = raviX_allocate_scope(compiler_state,pAVar17,pSVar16);
  (pAVar12->field_2).test_then_block.test_then_scope = pSVar16;
  pSVar9 = raviX_create_string(compiler_state,"break",6);
  pAVar17 = raviX_allocate_ast_node_at_line(compiler_state,STMT_GOTO,0);
  (pAVar17->field_2).goto_stmt.name = pSVar9;
  *(byte *)&pAVar17->field_2 = *(byte *)&pAVar17->field_2 | 1;
  (pAVar17->field_2).goto_stmt.goto_scope = pSVar16;
  add_ast_node(compiler_state,&(pAVar12->field_2).test_then_block.test_then_statement_list,pAVar17);
  add_ast_node(compiler_state,&(pAVar8->field_2).return_stmt.expr_list,pAVar12);
  add_ast_node(compiler_state,list_02,pAVar8);
  pAVar17 = raviX_allocate_ast_node_at_line(compiler_state,STMT_EXPR,piVar5[1]);
  (pAVar17->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar17->field_2).goto_stmt.name = (StringObject *)0x0;
  pAVar8 = make_symbol_expr(compiler_state,sym_00);
  add_ast_node(compiler_state,&(pAVar17->field_2).return_stmt.expr_list,pAVar8);
  pLVar10 = (LuaSymbol *)raviX_ptrlist_first(*(PtrList **)(piVar5 + 4));
  pAVar8 = make_symbol_expr(compiler_state,pLVar10);
  add_ast_node(compiler_state,&(pAVar17->field_2).local_stmt.expr_list,pAVar8);
  add_ast_node(compiler_state,list_02,pAVar17);
  pAVar17 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,piVar5[1]);
  (pAVar17->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar17->field_2).return_stmt.expr_list = pAVar19;
  add_ast_node(compiler_state,list_02,pAVar17);
  (pAVar17->field_2).goto_stmt.name = *(StringObject **)(piVar5 + 10);
  piVar5[2] = 0;
  piVar5[3] = 0;
  piVar5[8] = 0;
  piVar5[9] = 0;
  piVar5[10] = 0;
  piVar5[0xb] = 0;
  piVar20 = piVar5;
  for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
    uVar3 = pAVar7->line_number;
    piVar20[0] = pAVar7->type;
    piVar20[1] = uVar3;
    pAVar7 = (AstNode *)((long)pAVar7 + (ulong)bVar21 * -0x10 + 8);
    piVar20 = piVar20 + (ulong)bVar21 * -4 + 2;
  }
  if (*piVar5 != 4) {
    __assert_fail("node->type == STMT_DO",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_lower.c"
                  ,400,"void process_statement(CompilerState *, AstNode *)");
  }
  process_statement_list(compiler_state,*(AstNodeList **)(piVar5 + 4));
  goto LAB_0010aa60;
switchD_0010aa94_caseD_5:
  pAVar19 = *(AstNodeList **)(piVar5 + 4);
LAB_0010aab4:
  process_expression_list(compiler_state,pAVar19);
  goto switchD_0010aa94_caseD_0;
}

Assistant:

static void process_statement_list(CompilerState *compiler_state, AstNodeList *list)
{
	AstNode *node;
	FOR_EACH_PTR(list, AstNode, node) { process_statement(compiler_state, node); }
	END_FOR_EACH_PTR(node);
}